

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O3

TPZCompMesh * __thiscall
TPZHybridizeHDiv::CreateMultiphysicsMesh
          (TPZHybridizeHDiv *this,TPZMultiphysicsCompMesh *cmesh_HDiv,
          double Lagrange_term_multiplier)

{
  TPZGeoMesh *gmesh;
  TPZVec<TPZCompMesh_*> *pTVar1;
  TPZCompMesh *pTVar2;
  TPZMultiphysicsCompMesh *this_00;
  int i;
  long lVar3;
  TPZManVector<TPZCompMesh_*,_3> meshvec_Hybrid;
  TPZManVector<int,_5> active;
  int local_94;
  TPZManVector<TPZCompMesh_*,_3> local_90;
  TPZManVector<int,_5> local_58;
  
  pTVar1 = TPZMultiphysicsCompMesh::MeshVector(cmesh_HDiv);
  local_58.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector
            (&local_90,pTVar1->fNElements,(TPZCompMesh **)&local_58);
  lVar3 = 0;
  while( true ) {
    pTVar1 = TPZMultiphysicsCompMesh::MeshVector(cmesh_HDiv);
    if (pTVar1->fNElements <= lVar3) break;
    pTVar1 = TPZMultiphysicsCompMesh::MeshVector(cmesh_HDiv);
    pTVar2 = TPZCompMesh::Clone(pTVar1->fStore[lVar3]);
    local_90.super_TPZVec<TPZCompMesh_*>.fStore[lVar3] = pTVar2;
    lVar3 = lVar3 + 1;
  }
  InsertPeriferalMaterialObjects(this,&local_90.super_TPZVec<TPZCompMesh_*>);
  HybridizeInternalSides(this,&local_90.super_TPZVec<TPZCompMesh_*>);
  gmesh = (cmesh_HDiv->super_TPZCompMesh).fReference;
  this_00 = (TPZMultiphysicsCompMesh *)operator_new(0x9a8);
  TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh(this_00,gmesh);
  TPZCompMesh::CopyMaterials(&cmesh_HDiv->super_TPZCompMesh,(TPZCompMesh *)this_00);
  InsertPeriferalMaterialObjects(this,(TPZCompMesh *)this_00,Lagrange_term_multiplier);
  local_94 = 1;
  TPZManVector<int,_5>::TPZManVector
            (&local_58,local_90.super_TPZVec<TPZCompMesh_*>.fNElements,&local_94);
  TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
            (this_00,&local_58.super_TPZVec<int>,&local_90.super_TPZVec<TPZCompMesh_*>);
  if (local_58.super_TPZVec<int>.fStore != local_58.fExtAlloc) {
    local_58.super_TPZVec<int>.fNAlloc = 0;
    local_58.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_58.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_58.super_TPZVec<int>.fStore);
    }
  }
  if (local_90.super_TPZVec<TPZCompMesh_*>.fStore != local_90.fExtAlloc) {
    local_90.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
    local_90.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018144b0;
    if (local_90.super_TPZVec<TPZCompMesh_*>.fStore != (TPZCompMesh **)0x0) {
      operator_delete__(local_90.super_TPZVec<TPZCompMesh_*>.fStore);
    }
  }
  return &this_00->super_TPZCompMesh;
}

Assistant:

TPZCompMesh * TPZHybridizeHDiv::CreateMultiphysicsMesh(TPZMultiphysicsCompMesh *cmesh_HDiv, double Lagrange_term_multiplier /* = 1. */) {
    TPZManVector<TPZCompMesh *, 3> meshvec_Hybrid(cmesh_HDiv->MeshVector().size(), 0);
    for (int i = 0; i < cmesh_HDiv->MeshVector().size(); i++) {
        meshvec_Hybrid[i] = cmesh_HDiv->MeshVector()[i]->Clone();
    }
    InsertPeriferalMaterialObjects(meshvec_Hybrid);
    HybridizeInternalSides(meshvec_Hybrid);

    TPZGeoMesh *gmesh = cmesh_HDiv->Reference();
    TPZMultiphysicsCompMesh *cmesh_Hybrid = new TPZMultiphysicsCompMesh(gmesh);
    cmesh_HDiv->CopyMaterials(*cmesh_Hybrid);
    InsertPeriferalMaterialObjects(cmesh_Hybrid, Lagrange_term_multiplier);

    TPZManVector<int,5> active(meshvec_Hybrid.size(),1);
    cmesh_Hybrid->BuildMultiphysicsSpace(active, meshvec_Hybrid);
    return cmesh_Hybrid;
}